

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O0

void __thiscall fizplex::Base::Base(Base *this,ColMatrix *b)

{
  pointer pNVar1;
  size_t sVar2;
  size_t sVar3;
  ETM *this_00;
  ColMatrix *in_RSI;
  SVector *in_RDI;
  size_t i_1;
  size_t i;
  value_type *in_stack_ffffffffffffff48;
  ColMatrix *in_stack_ffffffffffffff50;
  SVector *e;
  size_t in_stack_ffffffffffffff68;
  pointer local_50;
  Base *in_stack_ffffffffffffffc0;
  pointer local_28;
  
  std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::vector
            ((vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *)0x139e81);
  ColMatrix::row_count(in_RSI);
  DVector::DVector((DVector *)in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
  pNVar1 = (pointer)ColMatrix::row_count(in_RSI);
  in_RDI[2].values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_start = pNVar1;
  std::make_unique<unsigned_long[]>(in_stack_ffffffffffffff68);
  sVar2 = ColMatrix::row_count(in_RSI);
  sVar3 = ColMatrix::col_count(in_RSI);
  if (sVar2 == sVar3) {
    for (local_28 = (pointer)0x0;
        local_28 <
        in_RDI[2].values.
        super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>.
        _M_impl.super__Vector_impl_data._M_start; local_28 = (pointer)((long)&local_28->index + 1))
    {
      e = in_RDI;
      this_00 = (ETM *)ColMatrix::column(in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48
                                        );
      ETM::ETM(this_00,e,(size_t)in_stack_ffffffffffffff50);
      std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::push_back
                ((vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *)
                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      ETM::~ETM((ETM *)0x13a01f);
    }
    for (local_50 = (pointer)0x0;
        local_50 <
        in_RDI[2].values.
        super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>.
        _M_impl.super__Vector_impl_data._M_start;
        local_50 = (pointer)((long)&((vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                                      *)&local_50->index)->
                                    super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                            + 1)) {
      pNVar1 = local_50;
      in_stack_ffffffffffffff50 =
           (ColMatrix *)
           std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
                     ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                      in_stack_ffffffffffffff50,(size_t)local_50);
      (in_stack_ffffffffffffff50->cols).
      super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pNVar1;
    }
    invert(in_stack_ffffffffffffffc0);
    return;
  }
  __assert_fail("b.row_count() == b.col_count()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base.cc"
                ,8,"fizplex::Base::Base(const ColMatrix &)");
}

Assistant:

Base::Base(const ColMatrix &b)
    : work(b.row_count()), m(b.row_count()),
      row_ordering(std::make_unique<size_t[]>(m)) {
  assert(b.row_count() == b.col_count());
  for (size_t i = 0; i < m; i++)
    etms.push_back(ETM(b.column(i), i));
  for (size_t i = 0; i < m; i++)
    row_ordering[i] = i;
  invert();
}